

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

void pstack::print_container<pstack::ReaderArray<Elf64_Sym,42ul>,pstack::Elf::Section_const&>
               (ostream *os,ReaderArray<Elf64_Sym,_42UL> *container,Section *ctx)

{
  value_type *pvVar1;
  size_t sVar2;
  size_t idx;
  char *__s;
  JSON<Elf64_Sym,_pstack::Elf::Section> local_48;
  ReaderArray<Elf64_Sym,_42UL> *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ ",2);
  if (container->eof != 0) {
    __s = "";
    idx = 0;
    local_38 = container;
    do {
      pvVar1 = ReaderArray<Elf64_Sym,_42UL>::getitem(container,idx);
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
      container = local_38;
      local_48.object = pvVar1;
      local_48.context = ctx;
      operator<<(os,&local_48);
      idx = idx + 1;
      __s = ",\n";
    } while (idx != container->eof);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}